

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::anon_unknown_26::TestGroup::TestGroup
          (TestGroup *this,IEventListenerPtr *reporter,Config *config)

{
  set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
  *this_00;
  _Rb_tree_header *__position;
  Config *pCVar1;
  pointer pFVar2;
  TestCaseHandle **ppTVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar7;
  undefined4 extraout_var_00;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *testCases;
  TestSpec *this_01;
  TestCaseHandle *test;
  pointer pFVar8;
  TestCaseHandle **__v;
  size_t in_R8;
  FilterMatch *match;
  undefined1 local_78 [8];
  _Rb_tree_node_base _Stack_70;
  size_t local_50;
  Matches local_48;
  undefined4 extraout_var_01;
  
  this->m_reporter = reporter->m_ptr;
  this->m_config = config;
  RunContext::RunContext(&this->m_context,&config->super_IConfig,reporter);
  this_00 = &this->m_tests;
  __position = &(this->m_tests)._M_t._M_impl.super__Rb_tree_header;
  (this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &__position->_M_header;
  (this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &__position->_M_header;
  (this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_matches).
  super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_matches).
  super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_matches).
  super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_unmatchedTestSpecs = false;
  iVar4 = (*(this->m_config->super_IConfig)._vptr_IConfig[0xd])();
  if (*(long *)(CONCAT44(extraout_var,iVar4) + 0x18) !=
      *(long *)(CONCAT44(extraout_var,iVar4) + 0x20)) {
    __assert_fail("m_config->testSpec().getInvalidSpecs().empty() && \"Invalid test specs should be handled before running tests\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                  ,0x434,
                  "Catch::(anonymous namespace)::TestGroup::TestGroup(IEventListenerPtr &&, const Config *)"
                 );
  }
  pCVar1 = this->m_config;
  pSVar7 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar4 = (*(pSVar7->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar7);
  testCases = (vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x20))
                        ((long *)CONCAT44(extraout_var_00,iVar4),pCVar1);
  iVar4 = (*(this->m_config->super_IConfig)._vptr_IConfig[0xd])();
  this_01 = (TestSpec *)CONCAT44(extraout_var_01,iVar4);
  if ((this_01->m_filters).
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this_01->m_filters).
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pFVar8 = (pointer)(testCases->
                      super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                      )._M_impl.super__Vector_impl_data._M_start;
    pFVar2 = (pointer)(testCases->
                      super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
    if (pFVar8 != pFVar2) {
      do {
        if ((((TestCaseInfo *)(pFVar8->name)._M_dataplus._M_p)->properties & IsHidden) == None) {
          local_78 = (undefined1  [8])pFVar8;
          std::
          _Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
          ::_M_emplace_unique<Catch::TestCaseHandle_const*>
                    ((_Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
                      *)this_00,(TestCaseHandle **)local_78);
        }
        pFVar8 = (pointer)&(pFVar8->name).field_2;
      } while (pFVar8 != pFVar2);
    }
  }
  else {
    TestSpec::matchesByFilter(&local_48,this_01,testCases,&this->m_config->super_IConfig);
    _Stack_70._M_parent =
         (_Base_ptr)
         (this->m_matches).
         super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_matches).
    super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_48.
         super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_78 = (undefined1  [8])
               (this->m_matches).
               super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
               ._M_impl.super__Vector_impl_data._M_start;
    _Stack_70._0_8_ =
         (this->m_matches).
         super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->m_matches).
    super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_48.
         super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->m_matches).
    super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_48.
         super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
    ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
            local_78);
    std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
    ~vector(&local_48);
    pFVar8 = (this->m_matches).
             super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pFVar2 = (this->m_matches).
             super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pFVar8 != pFVar2) {
      do {
        ppTVar3 = (pFVar8->tests).
                  super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_78 = (undefined1  [8])this_00;
        for (__v = (pFVar8->tests).
                   super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; __v != ppTVar3; __v = __v + 1) {
          std::
          _Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
          ::
          _M_insert_unique_<Catch::TestCaseHandle_const*const&,std::_Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>::_Alloc_node>
                    ((_Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
                      *)this_00,(const_iterator)__position,__v,(_Alloc_node *)local_78);
        }
        pFVar8 = pFVar8 + 1;
      } while (pFVar8 != pFVar2);
    }
  }
  uVar5 = (*(this->m_config->super_IConfig)._vptr_IConfig[0x12])();
  uVar6 = (*(this->m_config->super_IConfig)._vptr_IConfig[0x13])();
  createShard<std::set<Catch::TestCaseHandle_const*,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>>
            ((set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
              *)local_78,(Catch *)this_00,
             (set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
              *)(ulong)uVar5,(ulong)uVar6,in_R8);
  std::
  _Rb_tree<const_Catch::TestCaseHandle_*,_const_Catch::TestCaseHandle_*,_std::_Identity<const_Catch::TestCaseHandle_*>,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
  ::clear(&this_00->_M_t);
  if ((pointer)_Stack_70._M_parent != (pointer)0x0) {
    (this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Stack_70._M_color;
    (this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = _Stack_70._M_parent;
    (this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = _Stack_70._M_left;
    (this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = _Stack_70._M_right;
    ((string *)&(_Stack_70._M_parent)->_M_color)->_M_string_length = (size_type)__position;
    (this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_node_count = local_50;
    _Stack_70._M_parent = (_Base_ptr)0x0;
    local_50 = 0;
    _Stack_70._M_left = &_Stack_70;
    _Stack_70._M_right = &_Stack_70;
  }
  std::
  _Rb_tree<const_Catch::TestCaseHandle_*,_const_Catch::TestCaseHandle_*,_std::_Identity<const_Catch::TestCaseHandle_*>,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
  ::~_Rb_tree((_Rb_tree<const_Catch::TestCaseHandle_*,_const_Catch::TestCaseHandle_*,_std::_Identity<const_Catch::TestCaseHandle_*>,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
               *)local_78);
  return;
}

Assistant:

explicit TestGroup(IEventListenerPtr&& reporter, Config const* config):
                m_reporter(reporter.get()),
                m_config{config},
                m_context{config, CATCH_MOVE(reporter)} {

                assert( m_config->testSpec().getInvalidSpecs().empty() &&
                        "Invalid test specs should be handled before running tests" );

                auto const& allTestCases = getAllTestCasesSorted(*m_config);
                auto const& testSpec = m_config->testSpec();
                if ( !testSpec.hasFilters() ) {
                    for ( auto const& test : allTestCases ) {
                        if ( !test.getTestCaseInfo().isHidden() ) {
                            m_tests.emplace( &test );
                        }
                    }
                } else {
                    m_matches =
                        testSpec.matchesByFilter( allTestCases, *m_config );
                    for ( auto const& match : m_matches ) {
                        m_tests.insert( match.tests.begin(),
                                        match.tests.end() );
                    }
                }

                m_tests = createShard(m_tests, m_config->shardCount(), m_config->shardIndex());
            }